

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_close_stream_on_goaway(nghttp2_session *session,int32_t last_stream_id,int incoming)

{
  nghttp2_stream *pnVar1;
  int iVar2;
  int iVar3;
  nghttp2_session *local_50;
  nghttp2_close_stream_on_goaway_arg arg;
  nghttp2_stream *next_stream;
  nghttp2_stream *stream;
  int rv;
  int incoming_local;
  int32_t last_stream_id_local;
  nghttp2_session *session_local;
  
  arg.session = (nghttp2_session *)0x0;
  local_50 = session;
  arg.head._0_4_ = last_stream_id;
  arg.head._4_4_ = incoming;
  iVar2 = nghttp2_map_each(&session->streams,find_stream_on_goaway_func,&local_50);
  if (iVar2 != 0) {
    __assert_fail("rv == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0xb09,"int session_close_stream_on_goaway(nghttp2_session *, int32_t, int)");
  }
  next_stream = (nghttp2_stream *)arg.session;
  do {
    if (next_stream == (nghttp2_stream *)0x0) {
      return 0;
    }
    arg._16_8_ = next_stream->closed_next;
    next_stream->closed_next = (nghttp2_stream *)0x0;
    iVar2 = nghttp2_session_close_stream(session,next_stream->stream_id,7);
    next_stream = (nghttp2_stream *)arg._16_8_;
    iVar3 = nghttp2_is_fatal(iVar2);
  } while (iVar3 == 0);
  while (next_stream != (nghttp2_stream *)0x0) {
    pnVar1 = next_stream->closed_next;
    next_stream->closed_next = (nghttp2_stream *)0x0;
    next_stream = pnVar1;
  }
  return iVar2;
}

Assistant:

static int session_close_stream_on_goaway(nghttp2_session *session,
                                          int32_t last_stream_id,
                                          int incoming) {
  int rv;
  nghttp2_stream *stream, *next_stream;
  nghttp2_close_stream_on_goaway_arg arg = {session, NULL, last_stream_id,
                                            incoming};

  rv = nghttp2_map_each(&session->streams, find_stream_on_goaway_func, &arg);
  assert(rv == 0);

  stream = arg.head;
  while (stream) {
    next_stream = stream->closed_next;
    stream->closed_next = NULL;
    rv = nghttp2_session_close_stream(session, stream->stream_id,
                                      NGHTTP2_REFUSED_STREAM);

    /* stream may be deleted here */

    stream = next_stream;

    if (nghttp2_is_fatal(rv)) {
      /* Clean up closed_next member just in case */
      while (stream) {
        next_stream = stream->closed_next;
        stream->closed_next = NULL;
        stream = next_stream;
      }
      return rv;
    }
  }

  return 0;
}